

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O2

Vec_Str_t *
Abc_NtkClpGiaOne(Gia_Man_t *p,int iCo,int nCubeLim,int nBTLimit,int fCanon,int fReverse,
                Vec_Int_t *vSupp,int fVerbose,Vec_Int_t *vClass,Vec_Wec_t *vSupps)

{
  Gia_Man_t *p_00;
  Vec_Str_t *vSop;
  abctime aVar1;
  abctime time;
  int iCo_local;
  abctime local_38;
  
  iCo_local = iCo;
  local_38 = Abc_Clock();
  p_00 = Gia_ManDupCones(p,&iCo_local,1,1);
  if (fVerbose != 0) {
    printf("Output %4d:  Supp = %4d. Cone =%6d.\n",(ulong)(uint)iCo_local,(ulong)(uint)vSupp->nSize,
           (ulong)(uint)(~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs));
  }
  vSop = Bmc_CollapseOneOld(p_00,nCubeLim,nBTLimit,fCanon,fReverse,fVerbose);
  Gia_ManStop(p_00);
  if (vSop != (Vec_Str_t *)0x0) {
    Abc_NtkCollapseReduce(vSop,vSupp,vClass,vSupps);
    if (fVerbose != 0) {
      printf("Supp new = %4d. Sop = %4d.  ",(ulong)(uint)vSupp->nSize,
             (long)vSop->nSize / (long)(int)(vSupp->nSize + 3) & 0xffffffff);
      aVar1 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar1 - local_38),time);
    }
  }
  return vSop;
}

Assistant:

Vec_Str_t * Abc_NtkClpGiaOne( Gia_Man_t * p, int iCo, int nCubeLim, int nBTLimit, int fCanon, int fReverse, Vec_Int_t * vSupp, int fVerbose, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    Vec_Str_t * vSop;
    abctime clk = Abc_Clock();
    extern Vec_Str_t * Bmc_CollapseOneOld( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    Gia_Man_t * pGia  = Gia_ManDupCones( p, &iCo, 1, 1 );
    if ( fVerbose )
        printf( "Output %4d:  Supp = %4d. Cone =%6d.\n", iCo, Vec_IntSize(vSupp), Gia_ManAndNum(pGia) );
    vSop = Bmc_CollapseOneOld( pGia, nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    Gia_ManStop( pGia );
    if ( vSop == NULL )
        return NULL;
    Abc_NtkCollapseReduce( vSop, vSupp, vClass, vSupps );
    if ( fVerbose )
        printf( "Supp new = %4d. Sop = %4d.  ", Vec_IntSize(vSupp), Vec_StrSize(vSop)/(Vec_IntSize(vSupp) +3) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vSop; 
}